

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O2

bool ImGui::SelectableTooltip
               (char *label,bool *p_selected,bool bEnabled,char *tip,ImGuiSelectableFlags flags,
               ImVec2 *size)

{
  bool bVar1;
  bool bVar2;
  uint flags_00;
  undefined7 in_register_00000011;
  
  flags_00 = flags | 8;
  if ((int)CONCAT71(in_register_00000011,bEnabled) != 0) {
    flags_00 = flags;
  }
  bVar1 = Selectable(label,p_selected,flags_00,size);
  if (tip != (char *)0x0) {
    bVar2 = IsItemHovered(0);
    if (bVar2) {
      SetTooltip("%s",tip);
    }
  }
  return bVar1;
}

Assistant:

IMGUI_API bool SelectableTooltip(const char* label,
                                 bool* p_selected,
                                 bool bEnabled,
                                 const char* tip,
                                 ImGuiSelectableFlags flags,
                                 const ImVec2& size)
{
    // Turn background green when selected
    // do the selectable and remember the return value
    if (!bEnabled)
        flags |= ImGuiSelectableFlags_Disabled;
    const bool bRet = ImGui::Selectable(label, p_selected,flags, size);
    // if given do a tooltip
    if (tip && IsItemHovered())
        SetTooltip("%s", tip);
    // return if it was just clicked
    return bRet;
}